

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86.cpp
# Opt level: O2

int __thiscall
ncnn::MultiHeadAttention_x86::forward
          (MultiHeadAttention_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *_opt)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pMVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int *piVar8;
  size_t sVar9;
  long *plVar10;
  undefined4 uVar11;
  long lVar12;
  Allocator *pAVar13;
  Allocator *pAVar14;
  int iVar15;
  int iVar16;
  int _w;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  pointer pMVar23;
  pointer pMVar24;
  long lVar25;
  void *pvVar26;
  int *piVar27;
  long lVar28;
  Option opt1;
  long local_318;
  Mat local_308;
  long local_2c0;
  Mat local_2b8;
  MultiHeadAttention_x86 *local_270;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_bottom_blobs;
  Mat local_1d8;
  void *local_188;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  Allocator *local_168;
  undefined4 uStack_160;
  int iStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 local_150;
  undefined8 local_148;
  void *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  int local_120;
  Allocator *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined8 local_f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_f0;
  pointer local_e8;
  int *local_e0;
  vector<int,_std::allocator<int>_> retqkvs;
  vector<int,_std::allocator<int>_> retqks;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_bottom_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_top_blobs;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar18 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar5;
  local_e8 = pMVar5;
  if (lVar18 == 0x48) {
    iVar17 = (this->super_MultiHeadAttention).attn_mask;
    pMVar23 = pMVar5;
LAB_004ba91d:
    pMVar24 = pMVar23;
    if (iVar17 != 0) goto LAB_004ba960;
    local_2b8.cstep = 0;
    local_2b8.data = (void *)0x0;
    local_2b8.refcount._0_4_ = 0;
    local_2b8.refcount._4_4_ = 0;
    local_2b8.elemsize._0_4_ = 0;
    local_2b8.elemsize._4_4_ = 0;
    local_2b8.elempack = 0;
    local_2b8.allocator = (Allocator *)0x0;
    local_2b8.dims = 0;
    local_2b8.w = 0;
    local_2b8.h = 0;
    local_2b8.d = 0;
    local_2b8.c = 0;
  }
  else {
    iVar17 = (this->super_MultiHeadAttention).attn_mask;
    pMVar23 = pMVar5 + 1;
    pMVar24 = pMVar5;
    if (iVar17 == 0 || lVar18 != 0x90) {
      local_e8 = pMVar23;
      if (iVar17 == 0) {
        local_e8 = pMVar5 + 2;
      }
      if (lVar18 != 0xd8) {
        local_e8 = pMVar5 + 2;
      }
      if (lVar18 == 0x90) {
        local_e8 = pMVar23;
      }
      goto LAB_004ba91d;
    }
LAB_004ba960:
    local_2b8.data = *(void **)((long)pMVar5 + lVar18 + -0x48);
    piVar27 = *(int **)((long)pMVar5 + lVar18 + -0x40);
    local_2b8.refcount._0_4_ = SUB84(piVar27,0);
    local_2b8.refcount._4_4_ = (undefined4)((ulong)piVar27 >> 0x20);
    uVar6 = *(undefined8 *)((long)pMVar5 + lVar18 + -0x38);
    local_2b8.elemsize._0_4_ = (undefined4)uVar6;
    local_2b8.elemsize._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    local_2b8.elempack = *(int *)((long)pMVar5 + lVar18 + -0x30);
    local_2b8.allocator = *(Allocator **)((long)pMVar5 + lVar18 + -0x28);
    puVar1 = (undefined8 *)((long)pMVar5 + lVar18 + -0x20);
    uVar6 = *puVar1;
    uVar7 = puVar1[1];
    local_2b8.dims = (int)uVar6;
    local_2b8.w = (int)((ulong)uVar6 >> 0x20);
    local_2b8.h = (int)uVar7;
    local_2b8.d = (int)((ulong)uVar7 >> 0x20);
    local_2b8.c = *(int *)((long)pMVar5 + lVar18 + -0x10);
    local_2b8.cstep = *(size_t *)((long)pMVar5 + lVar18 + -8);
    if (piVar27 != (int *)0x0) {
      LOCK();
      *piVar27 = *piVar27 + 1;
      UNLOCK();
    }
  }
  piVar27 = &(this->super_MultiHeadAttention).attn_mask;
  opt.lightmode = _opt->lightmode;
  opt.use_shader_pack8 = _opt->use_shader_pack8;
  opt.use_subgroup_ops = _opt->use_subgroup_ops;
  opt.use_reserved_0 = _opt->use_reserved_0;
  opt.num_threads = _opt->num_threads;
  opt.blob_allocator = _opt->blob_allocator;
  opt.workspace_allocator._0_4_ = *(undefined4 *)&_opt->workspace_allocator;
  opt.workspace_allocator._4_4_ = *(undefined4 *)((long)&_opt->workspace_allocator + 4);
  opt.openmp_blocktime = _opt->openmp_blocktime;
  opt.use_winograd_convolution = _opt->use_winograd_convolution;
  opt.use_sgemm_convolution = _opt->use_sgemm_convolution;
  opt.use_int8_inference = _opt->use_int8_inference;
  opt.use_vulkan_compute = _opt->use_vulkan_compute;
  opt.use_bf16_storage = _opt->use_bf16_storage;
  opt.use_fp16_packed = _opt->use_fp16_packed;
  opt.use_fp16_storage = _opt->use_fp16_storage;
  opt.use_fp16_arithmetic = _opt->use_fp16_arithmetic;
  opt.use_int8_packed = _opt->use_int8_packed;
  opt.use_int8_storage = _opt->use_int8_storage;
  opt.use_int8_arithmetic = _opt->use_int8_arithmetic;
  opt.use_packing_layout = _opt->use_packing_layout;
  opt.vulkan_device_index = _opt->vulkan_device_index;
  opt.use_reserved_1 = _opt->use_reserved_1;
  opt.use_image_storage = _opt->use_image_storage;
  opt.use_tensor_storage = _opt->use_tensor_storage;
  opt.use_reserved_2 = _opt->use_reserved_2;
  opt.flush_denormals = _opt->flush_denormals;
  opt.use_local_pool_allocator = _opt->use_local_pool_allocator;
  opt.use_shader_local_memory = _opt->use_shader_local_memory;
  opt.use_cooperative_matrix = _opt->use_cooperative_matrix;
  opt.use_winograd23_convolution = _opt->use_winograd23_convolution;
  opt.use_winograd43_convolution = _opt->use_winograd43_convolution;
  opt.use_winograd63_convolution = _opt->use_winograd63_convolution;
  opt.use_a53_a55_optimized_kernel = _opt->use_a53_a55_optimized_kernel;
  opt.use_fp16_uniform = _opt->use_fp16_uniform;
  opt.use_int8_uniform = _opt->use_int8_uniform;
  opt.use_reserved_9 = _opt->use_reserved_9;
  opt.use_reserved_10 = _opt->use_reserved_10;
  opt.use_reserved_11 = _opt->use_reserved_11;
  if ((this->super_MultiHeadAttention).int8_scale_term != 0) {
    opt._36_4_ = opt._36_4_ & 0xffffff;
  }
  local_308.cstep = 0;
  local_308.data = (void *)0x0;
  local_308.refcount._0_4_ = 0;
  local_308.refcount._4_4_ = 0;
  local_308.elemsize._0_4_ = 0;
  local_308.elemsize._4_4_ = 0;
  local_308.elempack = 0;
  local_308.allocator = (Allocator *)0x0;
  local_308.dims = 0;
  local_308.w = 0;
  local_308.h = 0;
  local_308.d = 0;
  local_308.c = 0;
  local_f0 = top_blobs;
  if ((*piVar27 == 0) || (local_2b8.elempack == 1)) {
    piVar8 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    local_308.data = local_2b8.data;
    local_308.refcount._0_4_ = local_2b8.refcount._0_4_;
    local_308.refcount._4_4_ = local_2b8.refcount._4_4_;
    local_308.elemsize._0_4_ = (undefined4)local_2b8.elemsize;
    local_308.elemsize._4_4_ = local_2b8.elemsize._4_4_;
    local_308.elempack = local_2b8.elempack;
    local_308.allocator = local_2b8.allocator;
    local_308.dims = local_2b8.dims;
    local_308.w = local_2b8.w;
    local_308.h = local_2b8.h;
    local_308.d = local_2b8.d;
    local_308.c = local_2b8.c;
    local_308.cstep = local_2b8.cstep;
  }
  else {
    convert_packing(&local_2b8,&local_308,1,&opt);
    iVar17 = -100;
    if ((local_308.data == (void *)0x0) || ((long)local_308.c * local_308.cstep == 0))
    goto LAB_004bb194;
  }
  iVar16 = (this->super_MultiHeadAttention).embed_dim / (this->super_MultiHeadAttention).num_heads;
  _w = pMVar5->elempack * pMVar5->h;
  iVar2 = pMVar24->elempack;
  iVar3 = pMVar24->h;
  local_f8 = 0;
  local_138 = (void *)0x0;
  uStack_130 = 0;
  uStack_12c = 0;
  local_128 = 0;
  uStack_124 = 0;
  local_120 = 0;
  local_118 = (Allocator *)0x0;
  uStack_110 = 0;
  iStack_10c = 0;
  uStack_108 = 0;
  uStack_104 = 0;
  local_100 = 0;
  local_e0 = piVar27;
  iVar17 = (*this->q_gemm->_vptr_Layer[7])(this->q_gemm,pMVar5,&local_138,&opt);
  if (iVar17 == 0) {
    local_148 = 0;
    local_188 = (void *)0x0;
    uStack_180 = 0;
    uStack_17c = 0;
    local_178 = 0;
    uStack_174 = 0;
    local_170 = 0;
    local_168 = (Allocator *)0x0;
    uStack_160 = 0;
    iStack_15c = 0;
    uStack_158 = 0;
    uStack_154 = 0;
    local_150 = 0;
    iVar17 = (*this->k_gemm->_vptr_Layer[7])(this->k_gemm,pMVar24,&local_188,&opt);
    if (iVar17 == 0) {
      local_1d8.cstep = 0;
      local_1d8.data = (void *)0x0;
      local_1d8.refcount._0_4_ = 0;
      local_1d8.refcount._4_4_ = 0;
      local_1d8.elemsize._0_4_ = 0;
      local_1d8.elemsize._4_4_ = 0;
      local_1d8.elempack = 0;
      local_1d8.allocator = (Allocator *)0x0;
      local_1d8.dims = 0;
      local_1d8.w = 0;
      local_1d8.h = 0;
      local_1d8.d = 0;
      local_1d8.c = 0;
      Mat::create(&local_1d8,iVar2 * iVar3,(this->super_MultiHeadAttention).num_heads * _w,4,
                  opt.blob_allocator);
      iVar17 = -100;
      if ((local_1d8.data != (void *)0x0) && ((long)local_1d8.c * local_1d8.cstep != 0)) {
        retqks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        retqks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        retqks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::resize
                  (&retqks,(long)(this->super_MultiHeadAttention).num_heads);
        lVar18 = (long)iVar16;
        local_2c0 = (long)_w;
        local_318 = 0;
        lVar28 = 0;
        lVar25 = 0;
        local_270 = this;
        while( true ) {
          uVar4 = (this->super_MultiHeadAttention).num_heads;
          if ((int)uVar4 <= lVar25) break;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                    (&qk_bottom_blobs,2,(allocator_type *)&opt1);
          iVar2 = iStack_10c;
          pAVar13 = local_118;
          iVar17 = local_120;
          pMVar5 = qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
          lVar21 = (long)iStack_10c;
          sVar9 = CONCAT44(uStack_124,local_128);
          pvVar26 = (void *)(lVar28 * lVar21 * sVar9 + (long)local_138);
          piVar27 = (qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start)->refcount;
          if (piVar27 != (int *)0x0) {
            LOCK();
            *piVar27 = *piVar27 + -1;
            UNLOCK();
            if (*piVar27 == 0) {
              if ((qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                free((qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start)->data);
              }
              else {
                (*(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
              }
            }
          }
          iVar15 = iStack_15c;
          pAVar14 = local_168;
          iVar3 = local_170;
          pMVar23 = qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar5->data = pvVar26;
          pMVar5->refcount = (int *)0x0;
          pMVar5->elemsize = sVar9;
          pMVar5->elempack = iVar17;
          pMVar5->allocator = pAVar13;
          pMVar5->dims = 2;
          pMVar5->w = iVar2;
          pMVar5->h = iVar16;
          pMVar5->d = 1;
          pMVar5->c = 1;
          pMVar5->cstep = lVar21 * lVar18;
          lVar21 = (long)iStack_15c;
          sVar9 = CONCAT44(uStack_174,local_178);
          piVar27 = qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start[1].refcount;
          pvVar26 = (void *)(lVar28 * lVar21 * sVar9 + (long)local_188);
          if (piVar27 != (int *)0x0) {
            LOCK();
            *piVar27 = *piVar27 + -1;
            UNLOCK();
            if (*piVar27 == 0) {
              if (qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
                free(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].data);
              }
              else {
                (*(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
              }
            }
          }
          pMVar23[1].data = pvVar26;
          pMVar23[1].refcount = (int *)0x0;
          pMVar23[1].elemsize = sVar9;
          pMVar23[1].elempack = iVar3;
          pMVar23[1].allocator = pAVar14;
          pMVar23[1].dims = 2;
          pMVar23[1].w = iVar15;
          pMVar23[1].h = iVar16;
          pMVar23[1].d = 1;
          pMVar23[1].c = 1;
          pMVar23[1].cstep = lVar21 * lVar18;
          if (*local_e0 != 0) {
            if (local_308.dims == 3) {
              opt1._0_8_ = local_308.cstep * lVar25 *
                           CONCAT44(local_308.elemsize._4_4_,(undefined4)local_308.elemsize) +
                           (long)local_308.data;
              opt1.blob_allocator._0_4_ = 0;
              opt1.blob_allocator._4_4_ = 0;
              opt1.use_local_pool_allocator = true;
              opt1.use_shader_local_memory = false;
              opt1.use_cooperative_matrix = false;
              opt1.use_winograd23_convolution = false;
              opt1.use_winograd43_convolution = (bool)(undefined1)local_308.d;
              opt1.use_winograd63_convolution = (bool)local_308.d._1_1_;
              opt1.use_a53_a55_optimized_kernel = (bool)local_308.d._2_1_;
              opt1.use_fp16_uniform = (bool)local_308.d._3_1_;
              opt1.vulkan_device_index = 2;
            }
            else {
              piVar27 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
              opt1._0_8_ = local_308.data;
              opt1.blob_allocator._0_4_ = local_308.refcount._0_4_;
              opt1.blob_allocator._4_4_ = local_308.refcount._4_4_;
              opt1.vulkan_device_index = local_308.dims;
              opt1.use_local_pool_allocator = (bool)(undefined1)local_308.d;
              opt1.use_shader_local_memory = (bool)local_308.d._1_1_;
              opt1.use_cooperative_matrix = (bool)local_308.d._2_1_;
              opt1.use_winograd23_convolution = (bool)local_308.d._3_1_;
              opt1.use_winograd43_convolution = (bool)(undefined1)local_308.c;
              opt1.use_winograd63_convolution = (bool)local_308.c._1_1_;
              opt1.use_a53_a55_optimized_kernel = (bool)local_308.c._2_1_;
              opt1.use_fp16_uniform = (bool)local_308.c._3_1_;
              if (piVar27 != (int *)0x0) {
                LOCK();
                *piVar27 = *piVar27 + 1;
                UNLOCK();
              }
            }
            opt1.flush_denormals = local_308.h;
            opt1.use_reserved_1 = (bool)(undefined1)local_308.w;
            opt1.use_image_storage = (bool)local_308.w._1_1_;
            opt1.use_tensor_storage = (bool)local_308.w._2_1_;
            opt1.use_reserved_2 = (bool)local_308.w._3_1_;
            opt1._32_8_ = local_308.allocator;
            opt1.openmp_blocktime = local_308.elempack;
            opt1.workspace_allocator._4_4_ = local_308.elemsize._4_4_;
            opt1.workspace_allocator._0_4_ = (undefined4)local_308.elemsize;
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                      (&qk_bottom_blobs,(value_type *)&opt1);
            piVar27 = (int *)CONCAT44(opt1.blob_allocator._4_4_,opt1.blob_allocator._0_4_);
            if (piVar27 != (int *)0x0) {
              LOCK();
              *piVar27 = *piVar27 + -1;
              UNLOCK();
              if (*piVar27 == 0) {
                if (opt1._32_8_ == 0) {
                  free((void *)opt1._0_8_);
                }
                else {
                  (**(code **)(*(long *)opt1._32_8_ + 0x18))();
                }
              }
            }
          }
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                    (&qk_top_blobs,1,(allocator_type *)&opt1);
          iVar2 = local_1d8.w;
          pAVar13 = local_1d8.allocator;
          iVar17 = local_1d8.elempack;
          lVar22 = (long)local_1d8.w;
          lVar21 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
          pvVar26 = (void *)(local_318 * lVar22 * lVar21 + (long)local_1d8.data);
          plVar10 = (long *)CONCAT44(qk_top_blobs.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     qk_top_blobs.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_);
          piVar27 = (int *)plVar10[1];
          if (piVar27 != (int *)0x0) {
            LOCK();
            *piVar27 = *piVar27 + -1;
            UNLOCK();
            if (*piVar27 == 0) {
              if ((long *)plVar10[4] == (long *)0x0) {
                free((void *)*plVar10);
              }
              else {
                (**(code **)(*(long *)plVar10[4] + 0x18))();
              }
            }
          }
          this = local_270;
          lVar12 = local_2c0;
          *plVar10 = (long)pvVar26;
          plVar10[1] = 0;
          plVar10[2] = lVar21;
          *(int *)(plVar10 + 3) = iVar17;
          plVar10[4] = (long)pAVar13;
          *(undefined4 *)(plVar10 + 5) = 2;
          *(int *)((long)plVar10 + 0x2c) = iVar2;
          *(int *)(plVar10 + 6) = _w;
          *(undefined8 *)((long)plVar10 + 0x34) = 0x100000001;
          plVar10[8] = lVar22 * local_2c0;
          uVar11 = opt._0_4_;
          opt1.blob_allocator._0_4_ = opt.blob_allocator._0_4_;
          opt1.blob_allocator._4_4_ = opt.blob_allocator._4_4_;
          opt1.flush_denormals = opt.flush_denormals;
          opt1.use_local_pool_allocator = opt.use_local_pool_allocator;
          opt1.use_shader_local_memory = opt.use_shader_local_memory;
          opt1.use_cooperative_matrix = opt.use_cooperative_matrix;
          opt1.use_winograd23_convolution = opt.use_winograd23_convolution;
          opt1.use_winograd43_convolution = opt.use_winograd43_convolution;
          opt1.use_winograd63_convolution = opt.use_winograd63_convolution;
          opt1.use_a53_a55_optimized_kernel = opt.use_a53_a55_optimized_kernel;
          opt1.use_fp16_uniform = opt.use_fp16_uniform;
          opt1.use_int8_uniform = opt.use_int8_uniform;
          opt1.use_reserved_9 = opt.use_reserved_9;
          opt1.use_reserved_10 = opt.use_reserved_10;
          opt1.use_reserved_11 = opt.use_reserved_11;
          opt1.use_int8_packed = opt.use_int8_packed;
          opt1.use_int8_storage = opt.use_int8_storage;
          opt1.use_int8_arithmetic = opt.use_int8_arithmetic;
          opt1.use_packing_layout = opt.use_packing_layout;
          opt1.use_bf16_storage = opt.use_bf16_storage;
          opt1.use_fp16_packed = opt.use_fp16_packed;
          opt1.use_fp16_storage = opt.use_fp16_storage;
          opt1.use_fp16_arithmetic = opt.use_fp16_arithmetic;
          opt1.vulkan_device_index = opt.vulkan_device_index;
          opt1.use_reserved_1 = opt.use_reserved_1;
          opt1.use_image_storage = opt.use_image_storage;
          opt1.use_tensor_storage = opt.use_tensor_storage;
          opt1.use_reserved_2 = opt.use_reserved_2;
          opt1.workspace_allocator._0_4_ = opt.workspace_allocator._0_4_;
          opt1.workspace_allocator._4_4_ = opt.workspace_allocator._4_4_;
          opt1.openmp_blocktime = opt.openmp_blocktime;
          opt1.use_winograd_convolution = opt.use_winograd_convolution;
          opt1.use_sgemm_convolution = opt.use_sgemm_convolution;
          opt1.use_int8_inference = opt.use_int8_inference;
          opt1.use_vulkan_compute = opt.use_vulkan_compute;
          opt1.num_threads = 1;
          opt1.lightmode = (bool)(char)uVar11;
          opt1.use_shader_pack8 = (bool)(char)((uint)uVar11 >> 8);
          opt1.use_subgroup_ops = (bool)(char)((uint)uVar11 >> 0x10);
          opt1.use_reserved_0 = (bool)(char)((uint)uVar11 >> 0x18);
          iVar17 = (*local_270->qk_gemm->_vptr_Layer[6])
                             (local_270->qk_gemm,&qk_bottom_blobs,&qk_top_blobs,&opt1);
          retqks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar25] = iVar17;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&qk_top_blobs);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&qk_bottom_blobs);
          lVar25 = lVar25 + 1;
          lVar28 = lVar28 + lVar18;
          local_318 = local_318 + lVar12;
        }
        uVar20 = 0;
        uVar19 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar19 = uVar20;
        }
        do {
          if (uVar19 == uVar20) {
            piVar27 = (int *)CONCAT44(uStack_12c,uStack_130);
            if (piVar27 != (int *)0x0) {
              LOCK();
              *piVar27 = *piVar27 + -1;
              UNLOCK();
              if (*piVar27 == 0) {
                if (local_118 == (Allocator *)0x0) {
                  free(local_138);
                }
                else {
                  (*local_118->_vptr_Allocator[3])();
                }
              }
            }
            local_f8 = 0;
            local_138 = (void *)0x0;
            uStack_130 = 0;
            uStack_12c = 0;
            local_128 = 0;
            uStack_124 = 0;
            local_120 = 0;
            local_100 = 0;
            uStack_110 = 0;
            iStack_10c = 0;
            uStack_108 = 0;
            uStack_104 = 0;
            piVar27 = (int *)CONCAT44(uStack_17c,uStack_180);
            if (piVar27 != (int *)0x0) {
              LOCK();
              *piVar27 = *piVar27 + -1;
              UNLOCK();
              if (*piVar27 == 0) {
                if (local_168 == (Allocator *)0x0) {
                  free(local_188);
                }
                else {
                  (*local_168->_vptr_Allocator[3])();
                }
              }
            }
            local_148 = 0;
            local_188 = (void *)0x0;
            uStack_180 = 0;
            uStack_17c = 0;
            local_178 = 0;
            uStack_174 = 0;
            local_170 = 0;
            local_150 = 0;
            uStack_160 = 0;
            iStack_15c = 0;
            uStack_158 = 0;
            uStack_154 = 0;
            iVar17 = (*this->qk_softmax->_vptr_Layer[9])(this->qk_softmax,&local_1d8,&opt);
            if (iVar17 == 0) {
              opt1.lightmode = false;
              opt1.use_shader_pack8 = false;
              opt1.use_subgroup_ops = false;
              opt1.use_reserved_0 = false;
              opt1.num_threads = 0;
              opt1.blob_allocator._0_4_ = 0;
              opt1.blob_allocator._4_4_ = 0;
              opt1.workspace_allocator._0_4_ = 0;
              opt1.workspace_allocator._4_4_ = 0;
              opt1.openmp_blocktime = 0;
              opt1.use_bf16_storage = false;
              opt1.use_fp16_packed = false;
              opt1.use_fp16_storage = false;
              opt1.use_fp16_arithmetic = false;
              opt1.use_int8_packed = false;
              opt1.use_int8_storage = false;
              opt1.use_int8_arithmetic = false;
              opt1.use_packing_layout = false;
              opt1.vulkan_device_index = 0;
              opt1.use_reserved_1 = false;
              opt1.use_image_storage = false;
              opt1.use_tensor_storage = false;
              opt1.use_reserved_2 = false;
              opt1.flush_denormals = 0;
              opt1.use_local_pool_allocator = false;
              opt1.use_shader_local_memory = false;
              opt1.use_cooperative_matrix = false;
              opt1.use_winograd23_convolution = false;
              opt1.use_winograd43_convolution = false;
              opt1.use_winograd63_convolution = false;
              opt1.use_a53_a55_optimized_kernel = false;
              opt1.use_fp16_uniform = false;
              iVar17 = (*this->v_gemm->_vptr_Layer[7])(this->v_gemm,local_e8,&opt1,&opt);
              if (iVar17 == 0) {
                qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish._0_4_ = 0;
                qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish._4_4_ = 0;
                qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                Mat::create((Mat *)&qk_bottom_blobs,_w,
                            (this->super_MultiHeadAttention).num_heads * iVar16,4,opt.blob_allocator
                           );
                iVar17 = -100;
                piVar27 = (int *)CONCAT44(qk_bottom_blobs.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                          qk_bottom_blobs.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._0_4_);
                if (piVar27 != (int *)0x0) {
                  LOCK();
                  *piVar27 = *piVar27 + -1;
                  UNLOCK();
                  if (*piVar27 == 0) {
                    free(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start);
                  }
                }
              }
              piVar27 = (int *)CONCAT44(opt1.blob_allocator._4_4_,opt1.blob_allocator._0_4_);
              if (piVar27 != (int *)0x0) {
                LOCK();
                *piVar27 = *piVar27 + -1;
                UNLOCK();
                if (*piVar27 == 0) {
                  if (opt1._32_8_ == 0) {
                    free((void *)opt1._0_8_);
                  }
                  else {
                    (**(code **)(*(long *)opt1._32_8_ + 0x18))();
                  }
                }
              }
            }
            break;
          }
          iVar17 = retqks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar20];
          uVar20 = uVar20 + 1;
        } while (iVar17 == 0);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&retqks.super__Vector_base<int,_std::allocator<int>_>);
      }
      piVar27 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar27 != (int *)0x0) {
        LOCK();
        *piVar27 = *piVar27 + -1;
        UNLOCK();
        if (*piVar27 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) {
            free(local_1d8.data);
          }
          else {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar27 = (int *)CONCAT44(uStack_17c,uStack_180);
    if (piVar27 != (int *)0x0) {
      LOCK();
      *piVar27 = *piVar27 + -1;
      UNLOCK();
      if (*piVar27 == 0) {
        if (local_168 == (Allocator *)0x0) {
          free(local_188);
        }
        else {
          (*local_168->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar27 = (int *)CONCAT44(uStack_12c,uStack_130);
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + -1;
    UNLOCK();
    if (*piVar27 == 0) {
      if (local_118 == (Allocator *)0x0) {
        free(local_138);
      }
      else {
        (*local_118->_vptr_Allocator[3])();
      }
    }
  }
LAB_004bb194:
  piVar27 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + -1;
    UNLOCK();
    if (*piVar27 == 0) {
      if (local_308.allocator == (Allocator *)0x0) {
        free(local_308.data);
      }
      else {
        (*(local_308.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar27 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + -1;
    UNLOCK();
    if (*piVar27 == 0) {
      if (local_2b8.allocator == (Allocator *)0x0) {
        free(local_2b8.data);
      }
      else {
        (*(local_2b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int MultiHeadAttention_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& _opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    Option opt = _opt;
    if (int8_scale_term)
    {
        opt.use_packing_layout = false; // TODO enable packing
    }

    Mat attn_mask_blob_unpacked;
    if (attn_mask && attn_mask_blob.elempack != 1)
    {
        convert_packing(attn_mask_blob, attn_mask_blob_unpacked, 1, opt);
        if (attn_mask_blob_unpacked.empty())
            return -100;
    }
    else
    {
        attn_mask_blob_unpacked = attn_mask_blob;
    }

    const int embed_dim_per_head = embed_dim / num_heads;
    const int src_seqlen = q_blob.h * q_blob.elempack;
    const int dst_seqlen = k_blob.h * k_blob.elempack;

    Mat q_affine;
    int retq = q_gemm->forward(q_blob, q_affine, opt);
    if (retq != 0)
        return retq;

    Mat k_affine;
    int retk = k_gemm->forward(k_blob, k_affine, opt);
    if (retk != 0)
        return retk;

    Mat qk_cross(dst_seqlen, src_seqlen * num_heads, 4u, opt.blob_allocator);
    if (qk_cross.empty())
        return -100;

    std::vector<int> retqks;
    retqks.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qk_bottom_blobs(2);
        qk_bottom_blobs[0] = q_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        qk_bottom_blobs[1] = k_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob_unpacked.dims == 3 ? attn_mask_blob_unpacked.channel(i) : attn_mask_blob_unpacked;
            qk_bottom_blobs.push_back(maskm);
        }
        std::vector<Mat> qk_top_blobs(1);
        qk_top_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqks[i] = qk_gemm->forward(qk_bottom_blobs, qk_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqks[i] != 0)
            return retqks[i];
    }

    q_affine.release();
    k_affine.release();

    int retqk = qk_softmax->forward_inplace(qk_cross, opt);
    if (retqk != 0)
        return retqk;

    Mat v_affine;
    int retv = v_gemm->forward(v_blob, v_affine, opt);
    if (retv != 0)
        return retv;

    Mat qkv_cross(src_seqlen, embed_dim_per_head * num_heads, 4u, opt.blob_allocator);
    if (qkv_cross.empty())
        return -100;

    std::vector<int> retqkvs;
    retqkvs.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qkv_bottom_blobs(2);
        qkv_bottom_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        qkv_bottom_blobs[1] = v_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        std::vector<Mat> qkv_top_blobs(1);
        qkv_top_blobs[0] = qkv_cross.row_range(i * embed_dim_per_head, embed_dim_per_head);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqkvs[i] = qkv_gemm->forward(qkv_bottom_blobs, qkv_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqkvs[i] != 0)
            return retqkvs[i];
    }

    v_affine.release();

    int reto = o_gemm->forward(qkv_cross, top_blobs[0], opt);
    if (reto != 0)
        return reto;

    return 0;
}